

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O0

void xlsxioread_list_sheets
               (xlsxioreader handle,xlsxioread_list_sheets_callback_fn callback,void *callbackdata)

{
  XML_Parser local_38;
  main_sheet_list_callback_data sheetcallbackdata;
  void *callbackdata_local;
  xlsxioread_list_sheets_callback_fn callback_local;
  xlsxioreader handle_local;
  
  if ((handle != (xlsxioreader)0x0) && (callback != (xlsxioread_list_sheets_callback_fn)0x0)) {
    local_38 = (XML_Parser)0x0;
    sheetcallbackdata.xmlparser = (XML_Parser)callback;
    sheetcallbackdata.callback = (xlsxioread_list_sheets_callback_fn)callbackdata;
    sheetcallbackdata.callbackdata = callbackdata;
    iterate_files_by_contenttype
              (handle->zip,xlsx_content_type,xlsxioread_list_sheets_callback,&local_38,&local_38);
    iterate_files_by_contenttype
              (handle->zip,xlsm_content_type,xlsxioread_list_sheets_callback,&local_38,&local_38);
    iterate_files_by_contenttype
              (handle->zip,xltx_content_type,xlsxioread_list_sheets_callback,&local_38,&local_38);
    iterate_files_by_contenttype
              (handle->zip,xltm_content_type,xlsxioread_list_sheets_callback,&local_38,&local_38);
  }
  return;
}

Assistant:

DLL_EXPORT_XLSXIO void xlsxioread_list_sheets (xlsxioreader handle, xlsxioread_list_sheets_callback_fn callback, void* callbackdata)
{
  if (!handle || !callback)
    return;
  //process contents of main sheet
  struct main_sheet_list_callback_data sheetcallbackdata = {
    .xmlparser = NULL,
    .callback = callback,
    .callbackdata = callbackdata
  };
  iterate_files_by_contenttype(handle->zip, xlsx_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
  iterate_files_by_contenttype(handle->zip, xlsm_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
  iterate_files_by_contenttype(handle->zip, xltx_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
  iterate_files_by_contenttype(handle->zip, xltm_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
}